

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O1

void __thiscall
Minisat::Solver::binDRUP<Minisat::vec<Minisat::Lit>>
          (Solver *this,uchar op,vec<Minisat::Lit> *c,FILE *drup_file)

{
  int iVar1;
  uchar *puVar2;
  OnlineProofChecker *this_00;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  
  puVar2 = this->buf_ptr;
  this->buf_ptr = puVar2 + 1;
  *puVar2 = op;
  this->buf_len = this->buf_len + 1;
  this_00 = this->onlineDratChecker;
  if (this_00 != (OnlineProofChecker *)0x0) {
    if (op == 'a') {
      if ((this_00->tmpLits).data != (Lit *)0x0) {
        (this_00->tmpLits).sz = 0;
      }
      if (0 < c->sz) {
        lVar6 = 0;
        lVar7 = 0;
        do {
          if (*(int *)((long)&c->data->x + lVar6) != -2) {
            vec<Minisat::Lit>::push(&this_00->tmpLits,(Lit *)((long)&c->data->x + lVar6));
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 4;
        } while (lVar7 < c->sz);
      }
      bVar4 = OnlineProofChecker::addClause(this_00,&this_00->tmpLits,false);
      if (bVar4) goto LAB_0011e078;
    }
    else {
      bVar4 = OnlineProofChecker::removeClause<Minisat::vec<Minisat::Lit>>(this_00,c);
      if (bVar4) goto LAB_0011e078;
    }
    exit(0x86);
  }
LAB_0011e078:
  if (0 < c->sz) {
    lVar6 = 0;
    do {
      uVar5 = c->data[lVar6].x + 2;
      do {
        pbVar3 = this->buf_ptr;
        this->buf_ptr = pbVar3 + 1;
        *pbVar3 = (byte)uVar5 | 0x80;
        this->buf_len = this->buf_len + 1;
        bVar4 = 0x7f < uVar5;
        uVar5 = uVar5 >> 7;
      } while (bVar4);
      this->buf_ptr[-1] = this->buf_ptr[-1] & 0x7f;
      lVar6 = lVar6 + 1;
    } while (lVar6 < c->sz);
  }
  puVar2 = this->buf_ptr;
  this->buf_ptr = puVar2 + 1;
  *puVar2 = '\0';
  iVar1 = this->buf_len;
  uVar5 = iVar1 + 1;
  this->buf_len = uVar5;
  if (0xfffff < iVar1) {
    fwrite_unlocked(drup_buf,1,(ulong)uVar5,(FILE *)drup_file);
    this->buf_ptr = drup_buf;
    this->buf_len = 0;
  }
  return;
}

Assistant:

inline void binDRUP(unsigned char op, const V &c, FILE *drup_file)
    {
        assert(op == 'a' || op == 'd');
        *buf_ptr++ = op;
        buf_len++;
        if (onlineDratChecker) {
            if (op == 'a') {
                TRACE(if (!checkOnlineCheckerState(c)) {
                    std::cout << "c failed to validate online checker state" << std::endl;
                });

                if (!onlineDratChecker->addClause(c, lit_Undef)) {
                    exit(134);
                }
            } else {
                if (!onlineDratChecker->removeClause(c)) exit(134);
            }
        }
        for (int i = 0; i < c.size(); i++) byteDRUP(c[i]);
        *buf_ptr++ = 0;
        buf_len++;
        if (buf_len > 1048576) binDRUP_flush(drup_file);
    }